

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

SiPair * __thiscall
kj::Vector<kj::_::(anonymous_namespace)::SiPair>::add<kj::_::(anonymous_namespace)::SiPair>
          (Vector<kj::_::(anonymous_namespace)::SiPair> *this,SiPair *params)

{
  bool bVar1;
  SiPair *pSVar2;
  SiPair *params_local;
  Vector<kj::StringPtr> *this_local;
  
  bVar1 = ArrayBuilder<kj::_::(anonymous_namespace)::SiPair>::isFull
                    ((ArrayBuilder<kj::_::(anonymous_namespace)::SiPair> *)this);
  if (bVar1) {
    grow(this,0);
  }
  pSVar2 = fwd<kj::_::(anonymous_namespace)::SiPair>(params);
  pSVar2 = ArrayBuilder<kj::_::(anonymous_namespace)::SiPair>::
           add<kj::_::(anonymous_namespace)::SiPair>
                     ((ArrayBuilder<kj::_::(anonymous_namespace)::SiPair> *)this,pSVar2);
  return pSVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }